

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::RunContext
          (RunContext *this,Ptr<const_Catch::IConfig> *config,
          Ptr<Catch::IStreamingReporter> *reporter)

{
  IConfig *pIVar1;
  IStreamingReporter *pIVar2;
  int iVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0016a930;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_0016a998;
  (*(config->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_50);
  (this->m_runInfo).name._M_dataplus._M_p = (pointer)&(this->m_runInfo).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_runInfo,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pIVar4 = getCurrentMutableContext();
  this->m_context = pIVar4;
  this->m_activeTestCase = (TestCase *)0x0;
  (this->m_testCaseTracker).nullableValue = (TestCaseTracker *)0x0;
  (this->m_lastResult).m_info.macroName._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_info.macroName.field_2;
  (this->m_lastResult).m_info.macroName._M_string_length = 0;
  (this->m_lastResult).m_info.macroName.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_info.lineInfo.file._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_info.lineInfo.file.field_2;
  (this->m_lastResult).m_info.lineInfo.file._M_string_length = 0;
  (this->m_lastResult).m_info.lineInfo.file.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_info.lineInfo.line = 0;
  (this->m_lastResult).m_info.capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_info.capturedExpression.field_2;
  (this->m_lastResult).m_info.capturedExpression._M_string_length = 0;
  (this->m_lastResult).m_info.capturedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_resultData.reconstructedExpression.field_2;
  (this->m_lastResult).m_resultData.reconstructedExpression._M_string_length = 0;
  (this->m_lastResult).m_resultData.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_resultData.message.field_2;
  (this->m_lastResult).m_resultData.message._M_string_length = 0;
  (this->m_lastResult).m_resultData.message.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_resultData.resultType = Unknown;
  pIVar1 = config->m_p;
  (this->m_config).m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->m_totals).testCases.failed = 0;
  (this->m_totals).testCases.failedButOk = 0;
  (this->m_totals).assertions.failedButOk = 0;
  (this->m_totals).testCases.passed = 0;
  (this->m_totals).assertions.passed = 0;
  (this->m_totals).assertions.failed = 0;
  pIVar2 = reporter->m_p;
  (this->m_reporter).m_p = pIVar2;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*(this->m_context->super_IContext)._vptr_IContext[3])();
  this->m_prevRunner = (IRunner *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(this->m_context->super_IContext)._vptr_IContext[2])();
  this->m_prevResultCapture = (IResultCapture *)CONCAT44(extraout_var_00,iVar3);
  (*(this->m_context->super_IContext)._vptr_IContext[6])(&this->m_prevConfig);
  (this->m_lastAssertionInfo).macroName._M_dataplus._M_p =
       (pointer)&(this->m_lastAssertionInfo).macroName.field_2;
  (this->m_lastAssertionInfo).macroName._M_string_length = 0;
  (this->m_lastAssertionInfo).macroName.field_2._M_local_buf[0] = '\0';
  (this->m_lastAssertionInfo).lineInfo.file._M_dataplus._M_p =
       (pointer)&(this->m_lastAssertionInfo).lineInfo.file.field_2;
  (this->m_lastAssertionInfo).lineInfo.file._M_string_length = 0;
  (this->m_lastAssertionInfo).lineInfo.file.field_2._M_local_buf[0] = '\0';
  (this->m_lastAssertionInfo).lineInfo.line = 0;
  (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_lastAssertionInfo).capturedExpression.field_2;
  (this->m_lastAssertionInfo).capturedExpression._M_string_length = 0;
  (this->m_lastAssertionInfo).capturedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_unfinishedSections).
  super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,&this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar2,&this->m_runInfo);
  return;
}

Assistant:

explicit RunContext( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> const& reporter )
        :   m_runInfo( config->name() ),
            m_context( getCurrentMutableContext() ),
            m_activeTestCase( NULL ),
            m_config( config ),
            m_reporter( reporter ),
            m_prevRunner( m_context.getRunner() ),
            m_prevResultCapture( m_context.getResultCapture() ),
            m_prevConfig( m_context.getConfig() )
        {
            m_context.setRunner( this );
            m_context.setConfig( m_config );
            m_context.setResultCapture( this );
            m_reporter->testRunStarting( m_runInfo );
        }